

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::lookup<tcu::Vector<float,4>>
          (Environment *this,Variable<tcu::Vector<float,_4>_> *variable)

{
  pointer pcVar1;
  IVal *pIVar2;
  mapped_type *pmVar3;
  key_type local_38;
  
  pcVar1 = (variable->m_name)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + (variable->m_name)._M_string_length);
  pmVar3 = de::
           lookup<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
                     (&this->m_map,&local_38);
  pIVar2 = (IVal *)pmVar3->m_ptr;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pIVar2;
}

Assistant:

typename Traits<T>::IVal&	lookup	(const Variable<T>& variable) const
	{
		deUint8* const data = de::lookup(m_map, variable.getName()).get();

		return *reinterpret_cast<typename Traits<T>::IVal*>(data);
	}